

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * google::protobuf::internal::
       WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                 (ReflectiveFieldParser *field_parser,char *ptr,ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  byte bVar6;
  uint64 uVar7;
  uint uVar8;
  int iVar9;
  LogMessage *other;
  Message *pMVar10;
  undefined4 extraout_var;
  FieldDescriptor *pFVar11;
  UnknownFieldSet *pUVar12;
  string *psVar13;
  char *pcVar14;
  Descriptor *pDVar15;
  MessageLite *this;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long extraout_RDX_02;
  unsigned_long extraout_RDX_03;
  unsigned_long extraout_RDX_04;
  unsigned_long extraout_RDX_05;
  unsigned_long extraout_RDX_06;
  unsigned_long extraout_RDX_07;
  unsigned_long extraout_RDX_08;
  unsigned_long extraout_RDX_09;
  unsigned_long extraout_RDX_10;
  unsigned_long uVar16;
  byte *p;
  uint64 *puVar17;
  ReflectiveFieldParser *pRVar18;
  uint32 uVar19;
  uint uVar20;
  uint64 value;
  pair<const_char_*,_unsigned_int> pVar21;
  pair<const_char_*,_bool> pVar22;
  LogFinisher local_71;
  string *local_70;
  LogMessage local_68;
  
  pVar22._8_8_ = ctx;
  pVar22.first = ptr;
  local_70 = &field_parser->payload_;
LAB_0029ba82:
  pcVar14 = pVar22.first;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= pcVar14) {
    if ((long)pcVar14 - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
        (long)(ctx->super_EpsCopyInputStream).limit_) {
      return pcVar14;
    }
    pVar22 = EpsCopyInputStream::DoneFallback
                       (&ctx->super_EpsCopyInputStream,pcVar14,ctx->group_depth_);
    if (((undefined1  [16])pVar22 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      return pVar22.first;
    }
  }
  p = (byte *)pVar22.first;
  bVar5 = *p;
  uVar20 = (uint)bVar5;
  pVar21._8_8_ = pVar22._8_8_;
  pVar21.first = (char *)(p + 1);
  if ((char)bVar5 < '\0') {
    bVar6 = p[1];
    uVar20 = ((uint)bVar5 + (uint)bVar6 * 0x80) - 0x80;
    if ((char)bVar6 < '\0') {
      pVar21 = ReadTagFallback((char *)p,uVar20);
      if (pVar21.first == (char *)0x0) {
        return (char *)0x0;
      }
      uVar20 = pVar21.second;
    }
    else {
      pVar21.first = (char *)(p + 2);
    }
  }
  uVar16 = pVar21._8_8_;
  puVar17 = (uint64 *)pVar21.first;
  if ((uVar20 == 0) || (uVar8 = uVar20 & 7, uVar8 == 4)) {
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar20 - 1;
    return (char *)puVar17;
  }
  if (uVar20 < 8) {
    return (char *)0x0;
  }
  if (5 < uVar8) {
    return (char *)0x0;
  }
  uVar19 = uVar20 >> 3;
  switch(uVar8) {
  case 0:
    value = (uint64)(char)(byte)*puVar17;
    pVar22._8_8_ = uVar16;
    pVar22.first = (char *)((long)puVar17 + 1);
    if ((long)value < 0) {
      bVar5 = *(byte *)((long)puVar17 + 1);
      uVar20 = ((uint)(byte)*puVar17 + (uint)bVar5 * 0x80) - 0x80;
      if ((char)bVar5 < '\0') {
        pVar22 = (pair<const_char_*,_bool>)VarintParseSlow64((char *)puVar17,uVar20);
        value = pVar22._8_8_;
        if (pVar22.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        value = (uint64)uVar20;
        pVar22._8_8_ = (ulong)bVar5 << 7;
        pVar22.first = (char *)((long)puVar17 + 2);
      }
    }
    puVar17 = (uint64 *)pVar22.first;
    if ((uVar19 == 2) && (field_parser->is_item_ != false)) {
      uVar19 = (uint32)value;
      if ((field_parser->payload_)._M_string_length == 0) {
        field_parser->type_id_ = uVar19;
      }
      else {
        pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar19,2);
        if ((pFVar11 == (FieldDescriptor *)0x0) ||
           (pDVar15 = FieldDescriptor::message_type(pFVar11), pDVar15 == (Descriptor *)0x0)) {
          pUVar12 = field_parser->unknown_;
          if (pUVar12 == (UnknownFieldSet *)0x0) {
            pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_)
            ;
            field_parser->unknown_ = pUVar12;
          }
          psVar13 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar12,uVar19);
          std::__cxx11::string::swap((string *)psVar13);
          pVar22._8_8_ = extraout_RDX_09;
          pVar22.first = (char *)puVar17;
        }
        else {
          this = &Reflection::MutableMessage
                            (field_parser->reflection_,field_parser->msg_,pFVar11,
                             (MessageFactory *)0x0)->super_MessageLite;
          MessageLite::ParsePartialFromString(this,local_70);
          pVar22._8_8_ = extraout_RDX_07;
          pVar22.first = (char *)puVar17;
        }
      }
      goto LAB_0029ba82;
    }
    pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar19,0);
    if (pFVar11 == (FieldDescriptor *)0x0) {
      pUVar12 = field_parser->unknown_;
      if (pUVar12 == (UnknownFieldSet *)0x0) {
        pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
        field_parser->unknown_ = pUVar12;
      }
      UnknownFieldSet::AddVarint(pUVar12,uVar19,value);
      pVar22._8_8_ = extraout_RDX_10;
      pVar22.first = (char *)puVar17;
      goto LAB_0029ba82;
    }
    break;
  case 1:
    value = *puVar17;
    puVar17 = puVar17 + 1;
    pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar19,1);
    if (pFVar11 == (FieldDescriptor *)0x0) {
      pUVar12 = field_parser->unknown_;
      if (pUVar12 == (UnknownFieldSet *)0x0) {
        pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
        field_parser->unknown_ = pUVar12;
      }
      UnknownFieldSet::AddFixed64(pUVar12,uVar19,value);
      pVar22._8_8_ = extraout_RDX_02;
      pVar22.first = (char *)puVar17;
      goto LAB_0029ba82;
    }
    break;
  case 2:
    if ((uVar19 == 3) && (field_parser->is_item_ != false)) {
      uVar19 = field_parser->type_id_;
      psVar13 = local_70;
      if (uVar19 != 0) {
        field_parser->type_id_ = 0;
        goto LAB_0029bb94;
      }
    }
    else {
LAB_0029bb94:
      pRVar18 = field_parser;
      pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar19,2);
      if (pFVar11 != (FieldDescriptor *)0x0) {
        pcVar14 = ParseLenDelim((int)pRVar18,pFVar11,field_parser->msg_,field_parser->reflection_,
                                (char *)puVar17,ctx);
        uVar16 = extraout_RDX_00;
        goto LAB_0029bdee;
      }
      pUVar12 = field_parser->unknown_;
      if (pUVar12 == (UnknownFieldSet *)0x0) {
        pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
        field_parser->unknown_ = pUVar12;
      }
      psVar13 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(pUVar12,uVar19);
    }
    pcVar14 = InlineGreedyStringParser(psVar13,(char *)puVar17,ctx);
    uVar16 = extraout_RDX_06;
    goto LAB_0029bdee;
  case 3:
    if (((field_parser->is_item_ == false) && (uVar19 == 1)) &&
       (*(char *)(*(long *)(field_parser->descriptor_ + 0x20) + 0x48) != '\0')) {
      field_parser->is_item_ = true;
      iVar9 = ctx->depth_;
      ctx->depth_ = iVar9 + -1;
      if (iVar9 < 1) {
        pcVar14 = (char *)0x0;
      }
      else {
        ctx->group_depth_ = ctx->group_depth_ + 1;
        pcVar14 = WireFormatParser<google::protobuf::Message::_InternalParse(char_const*,google::protobuf::internal::ParseContext*)::ReflectiveFieldParser>
                            (field_parser,(char *)puVar17,ctx);
        uVar2 = ctx->depth_;
        uVar4 = ctx->group_depth_;
        ctx->depth_ = uVar2 + 1;
        ctx->group_depth_ = uVar4 + -1;
        uVar19 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        uVar16 = extraout_RDX_04;
        if (uVar19 != 0xb) {
          pcVar14 = (char *)0x0;
        }
      }
      field_parser->is_item_ = false;
      field_parser->type_id_ = 0;
    }
    else {
      pRVar18 = field_parser;
      pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar19,3);
      if (pFVar11 == (FieldDescriptor *)0x0) {
        pUVar12 = field_parser->unknown_;
        if (pUVar12 == (UnknownFieldSet *)0x0) {
          pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
          field_parser->unknown_ = pUVar12;
        }
        pcVar14 = UnknownFieldParse((ulong)(uVar20 & 0xfffffff8 | 3),pUVar12,(char *)puVar17,ctx);
        uVar16 = extraout_RDX_05;
      }
      else {
        pMVar10 = GetGroup((int)pRVar18,pFVar11,field_parser->msg_,field_parser->reflection_);
        iVar9 = ctx->depth_;
        ctx->depth_ = iVar9 + -1;
        if (iVar9 < 1) {
          return (char *)0x0;
        }
        ctx->group_depth_ = ctx->group_depth_ + 1;
        iVar9 = (*(pMVar10->super_MessageLite)._vptr_MessageLite[0xd])(pMVar10,puVar17,ctx);
        pcVar14 = (char *)CONCAT44(extraout_var,iVar9);
        uVar1 = ctx->depth_;
        uVar3 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar3 + -1;
        uVar19 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        uVar16 = extraout_RDX_01;
        if (uVar19 != (uVar20 & 0xfffffff8 | 3)) {
          return (char *)0x0;
        }
      }
    }
LAB_0029bdee:
    pVar22._8_8_ = uVar16;
    pVar22.first = pcVar14;
    if (pcVar14 == (char *)0x0) {
      return (char *)0x0;
    }
    goto LAB_0029ba82;
  case 4:
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/parse_context.h"
               ,0x2b7);
    other = LogMessage::operator<<(&local_68,"Can\'t happen");
    LogFinisher::operator=(&local_71,other);
    LogMessage::~LogMessage(&local_68);
    pVar22._8_8_ = extraout_RDX;
    pVar22.first = (char *)puVar17;
    goto LAB_0029ba82;
  case 5:
    uVar7 = *puVar17;
    value = (uint64)(uint)uVar7;
    puVar17 = (uint64 *)((long)puVar17 + 4);
    pFVar11 = Message::_InternalParse::ReflectiveFieldParser::Field(field_parser,uVar19,5);
    if (pFVar11 == (FieldDescriptor *)0x0) {
      pUVar12 = field_parser->unknown_;
      if (pUVar12 == (UnknownFieldSet *)0x0) {
        pUVar12 = Reflection::MutableUnknownFields(field_parser->reflection_,field_parser->msg_);
        field_parser->unknown_ = pUVar12;
      }
      UnknownFieldSet::AddFixed32(pUVar12,uVar19,(uint)uVar7);
      pVar22._8_8_ = extraout_RDX_03;
      pVar22.first = (char *)puVar17;
      goto LAB_0029ba82;
    }
  }
  SetField(value,pFVar11,field_parser->msg_,field_parser->reflection_);
  pVar22._8_8_ = extraout_RDX_08;
  pVar22.first = (char *)puVar17;
  goto LAB_0029ba82;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* WireFormatParser(T& field_parser,
                                                      const char* ptr,
                                                      ParseContext* ctx) {
  while (!ctx->Done(&ptr)) {
    uint32 tag;
    ptr = ReadTag(ptr, &tag);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
    if (tag == 0 || (tag & 7) == 4) {
      ctx->SetLastTag(tag);
      return ptr;
    }
    ptr = FieldParser(tag, field_parser, ptr, ctx);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr != nullptr);
  }
  return ptr;
}